

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O2

void __thiscall xe::ri::KernelSource::~KernelSource(KernelSource *this)

{
  (this->super_Item)._vptr_Item = (_func_int **)&PTR__KernelSource_00120ac8;
  std::__cxx11::string::~string((string *)&this->source);
  return;
}

Assistant:

~KernelSource	(void) {}